

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_last_ip.c
# Opt level: O3

int pt_last_ip_query(uint64_t *ip,pt_last_ip *last_ip)

{
  int iVar1;
  uint64_t uVar2;
  
  if (last_ip == (pt_last_ip *)0x0) {
    return -1;
  }
  if ((last_ip->field_0x8 & 1) == 0) {
    iVar1 = -0xb;
  }
  else {
    if ((last_ip->field_0x8 & 2) == 0) {
      if (ip == (uint64_t *)0x0) {
        return 0;
      }
      uVar2 = last_ip->ip;
      iVar1 = 0;
      goto LAB_001093ca;
    }
    iVar1 = -0xc;
  }
  if (ip == (uint64_t *)0x0) {
    return iVar1;
  }
  uVar2 = 0;
LAB_001093ca:
  *ip = uVar2;
  return iVar1;
}

Assistant:

int pt_last_ip_query(uint64_t *ip, const struct pt_last_ip *last_ip)
{
	if (!last_ip)
		return -pte_internal;

	if (!last_ip->have_ip) {
		if (ip)
			*ip = 0ull;
		return -pte_noip;
	}

	if (last_ip->suppressed) {
		if (ip)
			*ip = 0ull;
		return -pte_ip_suppressed;
	}

	if (ip)
		*ip = last_ip->ip;

	return 0;
}